

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O3

QDebug * operator<<(QDebug *debug,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *vector)

{
  undefined8 *puVar1;
  QTextStream *this;
  undefined8 *puVar2;
  QByteArrayView QVar3;
  QString local_48;
  
  puVar1 = *(undefined8 **)(vector + 8);
  for (puVar2 = *(undefined8 **)vector; puVar2 != puVar1; puVar2 = puVar2 + 4) {
    this = *(QTextStream **)debug;
    QVar3.m_data = (storage_type *)0x1;
    QVar3.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<(this,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
      }
    }
    if ((*(QTextStream **)debug)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)debug,' ');
    }
    QDebug::operator<<(debug,(char *)*puVar2);
  }
  return debug;
}

Assistant:

QDebug &operator<<(QDebug &debug, const std::vector<std::string> &vector) {
  for (const std::string &str : vector) {
    debug << "\n" << str;
  }
  return debug;
}